

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,string_view bytes,format_specs *specs)

{
  basic_appender<char> bVar1;
  anon_class_16_1_a7b7af8b local_10;
  
  local_10.bytes.size_ = (size_t)bytes.data_;
  local_10.bytes.data_ = (char *)out.container;
  bVar1 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,(format_specs *)bytes.size_,local_10.bytes.size_,
                     &local_10);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write_bytes(OutputIt out, string_view bytes,
                               const format_specs& specs = {}) -> OutputIt {
  return write_padded<Char, default_align>(
      out, specs, bytes.size(), [bytes](reserve_iterator<OutputIt> it) {
        const char* data = bytes.data();
        return copy<Char>(data, data + bytes.size(), it);
      });
}